

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O1

void __thiscall MyClientConnection::OnTick(MyClientConnection *this,uint64_t nowUsec)

{
  int iVar1;
  uint8_t data [2];
  TonkStatus status;
  undefined1 local_32;
  uint8_t local_31;
  TonkStatus local_30;
  
  tonk::SDKConnection::GetStatus(&local_30,&this->super_SDKConnection);
  iVar1 = this->StatusLogCounter;
  this->StatusLogCounter = iVar1 + 1;
  if (0x62 < iVar1) {
    this->StatusLogCounter = 0;
    test::LogTonkStatus(&this->super_SDKConnection);
    if ((((byte)local_30.Flags & 1) != 0) && (this->Client->StartedP2PConnection == false)) {
      local_32 = 2;
      test::FunctionTimer::BeginCall((FunctionTimer *)test::t_tonk_send);
      tonk::SDKConnection::Send(&this->super_SDKConnection,&local_32,1,0x32);
      test::FunctionTimer::EndCall((FunctionTimer *)test::t_tonk_send);
    }
  }
  local_32 = 200;
  OnTick::counter = OnTick::counter + '\x01';
  local_31 = OnTick::counter;
  tonk::SDKConnection::Send(&this->super_SDKConnection,&local_32,2,200);
  return;
}

Assistant:

void MyClientConnection::OnTick(
    uint64_t          nowUsec   // Current timestamp in microseconds
)
{
    TonkStatus status = GetStatus();

    if (++StatusLogCounter >= 100)
    {
        StatusLogCounter = 0;
        LogTonkStatus(this);

        if (status.Flags & TonkFlag_TimeSync)
        {
            if (!Client->StartedP2PConnection)
            {
                // Tell server we want to connect to another peer
                uint8_t data[1] = {};
                data[0] = ID_P2PConnectionStart;
                t_tonk_send.BeginCall();
                Send(data, sizeof(data), TonkChannel_Reliable0);
                t_tonk_send.EndCall();
            }
        }
    }

    {
        static uint8_t counter = 0;
        uint8_t data[2] = { 200, ++counter };
        Send(data, sizeof(data), TonkChannel_Unordered);
    }

#ifdef TONK_ENABLE_1MBPS_DATA_CLIENT
    const unsigned fillTargetMsec = kLowPriQueueDepthMsec + (status.TimerIntervalUsec / 1000);
    if (status.LowPriQueueMsec < fillTargetMsec)
    {
        unsigned fillMsec = fillTargetMsec - status.LowPriQueueMsec;
        unsigned bytes = (unsigned)(((uint64_t)status.AppBPS * fillMsec) / 1000);
        unsigned packetsToSend = (bytes + kLowPriBulkData_Bytes - 1) / kLowPriBulkData_Bytes;
        for (unsigned i = 0; i < packetsToSend; ++i)
        {
            uint8_t data[kLowPriBulkData_Bytes] = {};
            for (unsigned i = 0; i < kLowPriBulkData_Bytes; ++i) {
                data[i] = (uint8_t)i;
            }

            const uint16_t ts16 = ToRemoteTime16(nowUsec);
            const uint32_t ts23 = ToRemoteTime23(nowUsec);

            data[0] = (status.Flags & TonkFlag_TimeSync) ? ID_LowPriBulkData_HasTimestamp : ID_LowPriBulkData_NoTimestamp;
            tonk::WriteU16_LE(data + 1, ts16);
            tonk::WriteU24_LE(data + 1 + 2, ts23);
            tonk::WriteU24_LE(data + 1 + 2 + 3, kLowPriBulkMagic);
            tonk::WriteU32_LE(data + 1 + 2 + 3 + 3, NextOutgoingWord++);

            t_tonk_send.BeginCall();
            Send(data, sizeof(data), kLowPriBulkData_Channel);
            t_tonk_send.EndCall();
        }
    }
#endif
}